

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLp.cpp
# Opt level: O3

bool __thiscall HighsLp::equalButForScalingAndNames(HighsLp *this,HighsLp *lp)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ObjSense OVar9;
  ObjSense OVar10;
  size_t __n;
  double *pdVar11;
  double *pdVar12;
  bool bVar13;
  int iVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  double *pdVar18;
  byte bVar19;
  double *pdVar20;
  byte bVar21;
  bool bVar22;
  
  iVar5 = this->num_col_;
  iVar6 = this->num_row_;
  iVar7 = lp->num_col_;
  iVar8 = lp->num_row_;
  OVar9 = this->sense_;
  OVar10 = lp->sense_;
  dVar1 = this->offset_;
  dVar2 = lp->offset_;
  __n = (this->model_name_)._M_string_length;
  if (__n == (lp->model_name_)._M_string_length) {
    if (__n == 0) {
      bVar22 = true;
    }
    else {
      iVar14 = bcmp((this->model_name_)._M_dataplus._M_p,(lp->model_name_)._M_dataplus._M_p,__n);
      bVar22 = iVar14 == 0;
    }
  }
  else {
    bVar22 = false;
  }
  pdVar11 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar12 - (long)pdVar11 ==
      (long)(lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar11 == pdVar12) {
      bVar15 = 1;
    }
    else {
      do {
        pdVar18 = pdVar11 + 1;
        dVar3 = *pdVar11;
        dVar4 = *pdVar20;
        bVar15 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar11 = pdVar18;
      } while (pdVar18 != pdVar12);
    }
  }
  else {
    bVar15 = 0;
  }
  pdVar11 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar12 - (long)pdVar11 ==
      (long)(lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar11 == pdVar12) {
      bVar16 = 1;
    }
    else {
      do {
        pdVar18 = pdVar11 + 1;
        dVar3 = *pdVar11;
        dVar4 = *pdVar20;
        bVar16 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar11 = pdVar18;
      } while (pdVar18 != pdVar12);
    }
  }
  else {
    bVar16 = 0;
  }
  pdVar11 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar12 - (long)pdVar11 ==
      (long)(lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar11 == pdVar12) {
      bVar17 = 1;
    }
    else {
      do {
        pdVar18 = pdVar11 + 1;
        dVar3 = *pdVar11;
        dVar4 = *pdVar20;
        bVar17 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar11 = pdVar18;
      } while (pdVar18 != pdVar12);
    }
  }
  else {
    bVar17 = 0;
  }
  pdVar11 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar12 - (long)pdVar11 ==
      (long)(lp->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar11 == pdVar12) {
      bVar19 = 1;
    }
    else {
      do {
        pdVar18 = pdVar11 + 1;
        dVar3 = *pdVar11;
        dVar4 = *pdVar20;
        bVar19 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar11 = pdVar18;
      } while (pdVar18 != pdVar12);
    }
  }
  else {
    bVar19 = 0;
  }
  pdVar11 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar12 = (this->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pdVar20 = (lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)pdVar12 - (long)pdVar11 ==
      (long)(lp->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar20) {
    if (pdVar11 == pdVar12) {
      bVar21 = 1;
    }
    else {
      do {
        pdVar18 = pdVar11 + 1;
        dVar3 = *pdVar11;
        dVar4 = *pdVar20;
        bVar21 = -(dVar3 == dVar4) & 1;
        if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) break;
        pdVar20 = pdVar20 + 1;
        pdVar11 = pdVar18;
      } while (pdVar18 != pdVar12);
    }
  }
  else {
    bVar21 = 0;
  }
  bVar13 = HighsSparseMatrix::operator==(&this->a_matrix_,&lp->a_matrix_);
  return (bool)(bVar13 & dVar1 == dVar2 & bVar16 & bVar17 & bVar22 & bVar15 & bVar19 &
                         OVar9 == OVar10 & iVar6 == iVar8 & iVar5 == iVar7 & bVar21);
}

Assistant:

bool HighsLp::equalButForScalingAndNames(const HighsLp& lp) const {
  bool equal_vectors = true;
  equal_vectors = this->num_col_ == lp.num_col_ && equal_vectors;
  equal_vectors = this->num_row_ == lp.num_row_ && equal_vectors;
  equal_vectors = this->sense_ == lp.sense_ && equal_vectors;
  equal_vectors = this->offset_ == lp.offset_ && equal_vectors;
  equal_vectors = this->model_name_ == lp.model_name_ && equal_vectors;
  equal_vectors = this->col_cost_ == lp.col_cost_ && equal_vectors;
  equal_vectors = this->col_upper_ == lp.col_upper_ && equal_vectors;
  equal_vectors = this->col_lower_ == lp.col_lower_ && equal_vectors;
  equal_vectors = this->row_upper_ == lp.row_upper_ && equal_vectors;
  equal_vectors = this->row_lower_ == lp.row_lower_ && equal_vectors;
#ifndef NDEBUG
  if (!equal_vectors) printf("HighsLp::equalButForNames: Unequal vectors\n");
#endif
  const bool equal_matrix = this->a_matrix_ == lp.a_matrix_;
#ifndef NDEBUG
  if (!equal_matrix) printf("HighsLp::equalButForNames: Unequal matrix\n");
#endif
  return equal_vectors && equal_matrix;
}